

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::BitSet::equals(BitSet *this,BitSet *other)

{
  XMLSize_t XVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  bVar3 = true;
  if (this != other) {
    XVar1 = this->fUnitLen;
    if (XVar1 != other->fUnitLen) {
      return false;
    }
    if (XVar1 != 0) {
      lVar2 = 0;
      do {
        bVar3 = this->fBits[lVar2] == other->fBits[lVar2];
        if (!bVar3) {
          return bVar3;
        }
        bVar4 = XVar1 - 1 != lVar2;
        lVar2 = lVar2 + 1;
      } while (bVar4);
    }
  }
  return bVar3;
}

Assistant:

bool BitSet::equals(const BitSet& other) const
{
    if (this == &other)
        return true;

    if (fUnitLen != other.fUnitLen)
        return false;

    for (XMLSize_t i = 0; i < fUnitLen; i++)
    {
        if (fBits[i] != other.fBits[i])
            return false;
    }
    return true;
}